

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O2

int stdin2file(int handle)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  char recbuf [1000];
  
  iVar3 = 0;
  uVar5 = 0;
  do {
    iVar2 = fgetc(_stdin);
    if ((iVar2 == -1) || (1999 < uVar5)) {
      if (iVar3 == 6) {
LAB_00131ec5:
        sVar4 = fread(recbuf + 6,1,0x3e2,_stdin);
        iVar3 = file_write(handle,recbuf,sVar4 + 6);
        while (iVar3 == 0) {
          sVar4 = fread(recbuf,1,1000,_stdin);
          if (sVar4 == 0) {
            return 0;
          }
          iVar3 = file_write(handle,recbuf,sVar4);
        }
      }
      else {
        ffpmsg("Couldn\'t find the string \'SIMPLE\' in the stdin stream");
        iVar3 = 0x68;
      }
      return iVar3;
    }
    iVar1 = 0;
    if ((iVar2 == "first keyword not SIMPLE"[(long)iVar3 + 0x12]) &&
       (iVar1 = iVar3 + 1, iVar3 + 1 == 6)) {
      builtin_strncpy(recbuf,"SIMPLE",6);
      goto LAB_00131ec5;
    }
    iVar3 = iVar1;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int stdin2file(int handle)  /* handle number */
/*
  Copy the stdin stream to a file.  .
*/
{
    size_t nread;
    char simple[] = "SIMPLE";
    int c, ii, jj, status;
    char recbuf[RECBUFLEN];

    ii = 0;
    for(jj = 0; (c = fgetc(stdin)) != EOF && jj < 2000; jj++)
    {
       /* Skip over any garbage at the beginning of the stdin stream by */
       /* reading 1 char at a time, looking for 'S', 'I', 'M', 'P', 'L', 'E' */
       /* Give up if not found in the first 2000 characters */

       if (c == simple[ii])
       {
           ii++;
           if (ii == 6)   /* found the complete string? */
           {
              memcpy(recbuf, simple, 6);  /* copy "SIMPLE" to buffer */
              break;
           }
       }
       else
          ii = 0;  /* reset search to beginning of the string */
    }

   if (ii != 6)
   {
       ffpmsg("Couldn't find the string 'SIMPLE' in the stdin stream");
       return(FILE_NOT_OPENED);
   }

    /* fill up the remainder of the buffer */
    nread = fread(recbuf + 6, 1, RECBUFLEN - 6, stdin);
    nread += 6;  /* add in the 6 characters in 'SIMPLE' */

    status = file_write(handle, recbuf, nread);
    if (status)
       return(status);

    /* copy the rest of stdin stream */
    while(0 != (nread = fread(recbuf,1,RECBUFLEN, stdin)))
    {
        status = file_write(handle, recbuf, nread);
        if (status)
           return(status);
    }

    return(status);
}